

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O2

bool __thiscall re2::StringGenerator::IncrementDigits(StringGenerator *this)

{
  int iVar1;
  pointer pbVar2;
  pointer piVar3;
  pointer pbVar4;
  bool bVar5;
  uint in_EAX;
  ulong uVar6;
  ulong uVar7;
  undefined8 uStack_8;
  
  pbVar2 = (this->alphabet_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  piVar3 = (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
  pbVar4 = (this->alphabet_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar7 = uVar6 & 0xffffffff; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
    iVar1 = piVar3[uVar7 - 1];
    piVar3[uVar7 - 1] = iVar1 + 1;
    if (iVar1 + 1 < (int)((ulong)((long)pbVar2 - (long)pbVar4) >> 5)) goto LAB_00123151;
    piVar3[uVar7 - 1] = 0;
  }
  if ((int)uVar6 < this->maxlen_) {
    uStack_8 = (ulong)in_EAX;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->digits_,(int *)((long)&uStack_8 + 4));
LAB_00123151:
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool StringGenerator::IncrementDigits() {
  // First try to increment the current number.
  for (int i = static_cast<int>(digits_.size()) - 1; i >= 0; i--) {
    if (++digits_[i] < static_cast<int>(alphabet_.size()))
      return true;
    digits_[i] = 0;
  }

  // If that failed, make a longer number.
  if (static_cast<int>(digits_.size()) < maxlen_) {
    digits_.push_back(0);
    return true;
  }

  return false;
}